

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

int __thiscall QPDFObjectHandle::getIntValueAsInt(QPDFObjectHandle *this)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  longlong local_20;
  longlong v;
  QPDFObjectHandle *pQStack_10;
  int result;
  QPDFObjectHandle *this_local;
  
  v._4_4_ = 0;
  pQStack_10 = this;
  local_20 = getIntValue(this);
  if (local_20 < -0x80000000) {
    QTC::TC("qpdf","QPDFObjectHandle int returning INT_MIN",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"requested value of integer is too small; returning INT_MIN",
               &local_41);
    warnIfPossible(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    v._4_4_ = -0x80000000;
  }
  else if (local_20 < 0x80000000) {
    v._4_4_ = (int)local_20;
  }
  else {
    QTC::TC("qpdf","QPDFObjectHandle int returning INT_MAX",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"requested value of integer is too big; returning INT_MAX",
               &local_79);
    warnIfPossible(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    v._4_4_ = 0x7fffffff;
  }
  return v._4_4_;
}

Assistant:

int
QPDFObjectHandle::getIntValueAsInt() const
{
    int result = 0;
    long long v = getIntValue();
    if (v < INT_MIN) {
        QTC::TC("qpdf", "QPDFObjectHandle int returning INT_MIN");
        warnIfPossible("requested value of integer is too small; returning INT_MIN");
        result = INT_MIN;
    } else if (v > INT_MAX) {
        QTC::TC("qpdf", "QPDFObjectHandle int returning INT_MAX");
        warnIfPossible("requested value of integer is too big; returning INT_MAX");
        result = INT_MAX;
    } else {
        result = static_cast<int>(v);
    }
    return result;
}